

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objnam.c
# Opt level: O0

char * makeplural(char *oldstr)

{
  boolean bVar1;
  int iVar2;
  int iVar3;
  char *__dest;
  size_t sVar4;
  char *pcVar5;
  char *pcVar6;
  char *pcStack_30;
  int len;
  char *excess;
  char *str;
  char *spot;
  char *oldstr_local;
  
  __dest = nextobuf();
  pcStack_30 = (char *)0x0;
  for (spot = oldstr; *spot == ' '; spot = spot + 1) {
  }
  if (*spot == '\0') {
    warning("plural of null?");
    strcpy(__dest,"s");
    return __dest;
  }
  strcpy(__dest,spot);
  iVar2 = strncmp(__dest,"pair of ",8);
  str = __dest;
  if (iVar2 != 0) {
    for (; *str != '\0'; str = str + 1) {
      iVar2 = strncmp(str," of ",4);
      if (((((((iVar2 == 0) || (iVar2 = strncmp(str," [of ",5), iVar2 == 0)) ||
             (iVar2 = strncmp(str," labeled ",9), iVar2 == 0)) ||
            ((iVar2 = strncmp(str," called ",8), iVar2 == 0 ||
             (iVar2 = strncmp(str," named ",7), iVar2 == 0)))) ||
           ((iVar2 = strcmp(str," above"), iVar2 == 0 ||
            ((iVar2 = strncmp(str," versus ",8), iVar2 == 0 ||
             (iVar2 = strncmp(str," from ",6), iVar2 == 0)))))) ||
          (iVar2 = strncmp(str," in ",4), iVar2 == 0)) ||
         ((((iVar2 = strncmp(str,"-in-",4), iVar2 == 0 ||
            (iVar2 = strncmp(str," on ",4), iVar2 == 0)) ||
           (iVar2 = strncmp(str," a la ",6), iVar2 == 0)) ||
          (((iVar2 = strncmp(str," with",5), iVar2 == 0 ||
            (iVar2 = strncmp(str," de ",4), iVar2 == 0)) ||
           ((iVar2 = strncmp(str," d\'",3), iVar2 == 0 ||
            (iVar2 = strncmp(str," du ",4), iVar2 == 0)))))))) {
        pcStack_30 = spot + ((int)str - (int)__dest);
        *str = '\0';
        break;
      }
    }
    do {
      pcVar6 = str;
      str = pcVar6 + -1;
    } while (*str == ' ');
    *pcVar6 = '\0';
    sVar4 = strlen(__dest);
    iVar2 = (int)sVar4;
    if ((iVar2 == 1) || (bVar1 = letter(*str), bVar1 == '\0')) {
      strcpy(pcVar6,"\'s");
    }
    else if (((((((iVar2 != 2) || (iVar3 = strcmp(__dest,"ya"), iVar3 != 0)) &&
                ((iVar2 < 2 || (iVar3 = strcmp(pcVar6 + -2,"ai"), iVar3 != 0)))) &&
               ((iVar2 < 3 || (iVar3 = strcmp(pcVar6 + -3," ya"), iVar3 != 0)))) &&
              ((iVar2 < 4 ||
               ((((iVar3 = strcmp(pcVar6 + -4,"fish"), iVar3 != 0 &&
                  (iVar3 = strcmp(pcVar6 + -4,"tuna"), iVar3 != 0)) &&
                 (iVar3 = strcmp(pcVar6 + -4,"deer"), iVar3 != 0)) &&
                (iVar3 = strcmp(pcVar6 + -4,"yaki"), iVar3 != 0)))))) &&
             ((iVar2 < 5 ||
              ((((iVar3 = strcmp(pcVar6 + -5,"sheep"), iVar3 != 0 &&
                 (iVar3 = strcmp(pcVar6 + -5,"ninja"), iVar3 != 0)) &&
                ((iVar3 = strcmp(pcVar6 + -5,"ronin"), iVar3 != 0 &&
                 ((iVar3 = strcmp(pcVar6 + -5,"shito"), iVar3 != 0 &&
                  (iVar3 = strcmp(pcVar6 + -8,"shuriken"), iVar3 != 0)))))) &&
               ((iVar3 = strcmp(pcVar6 + -5,"tengu"), iVar3 != 0 &&
                (iVar3 = strcmp(pcVar6 + -5,"manes"), iVar3 != 0)))))))) &&
            (((iVar2 < 6 || (iVar3 = strcmp(pcVar6 + -6,"ki-rin"), iVar3 != 0)) &&
             (((iVar2 < 6 || (iVar3 = strcmp(pcVar6 + -6,"Nazgul"), iVar3 != 0)) &&
              ((iVar2 < 7 || (iVar3 = strcmp(pcVar6 + -7,"gunyoki"), iVar3 != 0)))))))) {
      if (((iVar2 < 3) ||
          ((iVar3 = strcmp(pcVar6 + -3,"man"), iVar3 != 0 ||
           ((5 < iVar2 && (iVar3 = strcmp(pcVar6 + -6,"shaman"), iVar3 == 0)))))) ||
         ((4 < iVar2 && (iVar3 = strcmp(pcVar6 + -5,"human"), iVar3 == 0)))) {
        if ((iVar2 < 5) || (iVar3 = strcmp(pcVar6 + -5,"tooth"), iVar3 != 0)) {
          iVar3 = strcmp(pcVar6 + -2,"fe");
          if (iVar3 == 0) {
            strcpy(pcVar6 + -2,"ves");
          }
          else {
            if (*str == 'f') {
              pcVar5 = strchr("lr",(int)pcVar6[-2]);
              if ((pcVar5 != (char *)0x0) ||
                 (pcVar5 = strchr("aeiouAEIOU",(int)pcVar6[-2]), pcVar5 != (char *)0x0)) {
                strcpy(str,"ves");
                goto LAB_00273260;
              }
              if ((4 < iVar2) && (iVar3 = strncmp(pcVar6 + -5,"staf",4), iVar3 == 0)) {
                strcpy(pcVar6 + -2,"ves");
                goto LAB_00273260;
              }
            }
            if ((iVar2 < 4) || (iVar3 = strcmp(pcVar6 + -4,"foot"), iVar3 != 0)) {
              if ((iVar2 < 3) || (iVar3 = strcmp(pcVar6 + -3,"ium"), iVar3 != 0)) {
                if (((iVar2 < 4) || (iVar3 = strcmp(pcVar6 + -4,"alga"), iVar3 != 0)) &&
                   ((iVar2 < 5 ||
                    ((iVar3 = strcmp(pcVar6 + -5,"hypha"), iVar3 != 0 &&
                     (iVar3 = strcmp(pcVar6 + -5,"larva"), iVar3 != 0)))))) {
                  if (((iVar2 < 4) || (iVar3 = strcmp(pcVar6 + -2,"us"), iVar3 != 0)) ||
                     ((4 < iVar2 &&
                      ((iVar3 = strcmp(pcVar6 + -5,"lotus"), iVar3 == 0 ||
                       ((5 < iVar2 && (iVar3 = strcmp(pcVar6 + -6,"wumpus"), iVar3 == 0)))))))) {
                    if ((iVar2 < 6) || (iVar3 = strcmp(pcVar6 + -4,"rtex"), iVar3 != 0)) {
                      if ((iVar2 < 6) || (iVar3 = strcmp(pcVar6 + -6,"djinni"), iVar3 != 0)) {
                        if ((iVar2 < 5) || (iVar3 = strcmp(pcVar6 + -5,"mumak"), iVar3 != 0)) {
                          if ((iVar2 < 3) || (iVar3 = strcmp(pcVar6 + -3,"sis"), iVar3 != 0)) {
                            if ((iVar2 < 6) || (iVar3 = strcmp(pcVar6 + -6,"erinys"), iVar3 != 0)) {
                              if (((iVar2 < 5) || (iVar3 = strcmp(pcVar6 + -4,"ouse"), iVar3 != 0))
                                 || (pcVar5 = strchr("MmLl",(int)pcVar6[-5]), pcVar5 == (char *)0x0)
                                 ) {
                                if ((iVar2 < 6) ||
                                   ((iVar3 = strcmp(pcVar6 + -6,"matzoh"), iVar3 != 0 &&
                                    (iVar3 = strcmp(pcVar6 + -6,"matzah"), iVar3 != 0)))) {
                                  if ((iVar2 < 5) ||
                                     ((iVar3 = strcmp(pcVar6 + -5,"matzo"), iVar3 != 0 &&
                                      (iVar3 = strcmp(pcVar6 + -6,"matza"), iVar3 != 0)))) {
                                    if ((iVar2 < 5) ||
                                       (iVar3 = strcmp(pcVar6 + -5,"child"), iVar3 != 0)) {
                                      pcVar5 = strchr("zxs",(int)*str);
                                      if ((pcVar5 == (char *)0x0) &&
                                         ((((iVar2 < 2 || (*str != 'h')) ||
                                           (pcVar5 = strchr("cs",(int)pcVar6[-2]),
                                           pcVar5 == (char *)0x0)) &&
                                          ((iVar2 < 4 ||
                                           (iVar2 = strcmp(pcVar6 + -3,"ato"), iVar2 != 0)))))) {
                                        if ((*str == 'y') &&
                                           (pcVar5 = strchr("aeiouAEIOU",(int)pcVar6[-2]),
                                           pcVar5 == (char *)0x0)) {
                                          strcpy(str,"ies");
                                        }
                                        else {
                                          strcpy(pcVar6,"s");
                                        }
                                      }
                                      else {
                                        strcpy(pcVar6,"es");
                                      }
                                    }
                                    else {
                                      strcpy(str,"dren");
                                    }
                                  }
                                  else {
                                    strcpy(str,"ot");
                                  }
                                }
                                else {
                                  strcpy(pcVar6 + -2,"ot");
                                }
                              }
                              else {
                                strcpy(pcVar6 + -4,"ice");
                              }
                            }
                            else {
                              strcpy(str,"es");
                            }
                          }
                          else {
                            pcVar6[-2] = 'e';
                          }
                        }
                        else {
                          strcpy(pcVar6,"il");
                        }
                      }
                      else {
                        *str = '\0';
                      }
                    }
                    else {
                      strcpy(pcVar6 + -2,"ices");
                    }
                  }
                  else {
                    *str = '\0';
                    pcVar6[-2] = 'i';
                  }
                }
                else {
                  strcpy(str,"ae");
                }
              }
              else {
                *str = '\0';
                pcVar6[-2] = 'a';
              }
            }
            else {
              strcpy(pcVar6 + -3,"eet");
            }
          }
        }
        else {
          strcpy(pcVar6 + -4,"eeth");
        }
      }
      else {
        pcVar6[-2] = 'e';
      }
    }
  }
LAB_00273260:
  if (pcStack_30 != (char *)0x0) {
    pcVar6 = eos(__dest);
    strcpy(pcVar6,pcStack_30);
  }
  return __dest;
}

Assistant:

char *makeplural(const char *oldstr)
{
	/* Note: cannot use strcmpi here -- it'd give MATZot, CAVEMeN,... */
	char *spot;
	char *str = nextobuf();
	const char *excess = NULL;
	int len;

	while (*oldstr==' ') oldstr++;
	if (!*oldstr) {
		warning("plural of null?");
		strcpy(str, "s");
		return str;
	}
	strcpy(str, oldstr);

	/*
	 * Skip changing "pair of" to "pairs of".  According to Webster, usual
	 * English usage is use pairs for humans, e.g. 3 pairs of dancers,
	 * and pair for objects and non-humans, e.g. 3 pair of boots.  We don't
	 * refer to pairs of humans in this game so just skip to the bottom.
	 */
	if (!strncmp(str, "pair of ", 8))
		goto bottom;

	/* Search for common compounds, ex. lump of royal jelly */
	for (spot=str; *spot; spot++) {
		if (!strncmp(spot, " of ", 4)
				/* DYWYPISI: pluralize "dart [of fire]" */
				|| !strncmp(spot, " [of ", 5)
				|| !strncmp(spot, " labeled ", 9)
				|| !strncmp(spot, " called ", 8)
				|| !strncmp(spot, " named ", 7)
				|| !strcmp(spot, " above") /* lurkers above */
				|| !strncmp(spot, " versus ", 8)
				|| !strncmp(spot, " from ", 6)
				|| !strncmp(spot, " in ", 4)
				|| !strncmp(spot, "-in-", 4) /* mother-in-law */
				|| !strncmp(spot, " on ", 4)
				|| !strncmp(spot, " a la ", 6)
				|| !strncmp(spot, " with", 5)	/* " with "? */
				|| !strncmp(spot, " de ", 4)
				|| !strncmp(spot, " d'", 3)
				|| !strncmp(spot, " du ", 4)) {
			excess = oldstr + (int) (spot - str);
			*spot = 0;
			break;
		}
	}
	spot--;
	while (*spot==' ') spot--; /* Strip blanks from end */
	*(spot+1) = 0;
	/* Now spot is the last character of the string */

	len = strlen(str);

	/* Single letters */
	if (len==1 || !letter(*spot)) {
		strcpy(spot+1, "'s");
		goto bottom;
	}

	/* Same singular and plural; mostly Japanese words except for "manes" */
	if ((len == 2 && !strcmp(str, "ya")) ||
	    (len >= 2 && !strcmp(spot-1, "ai")) || /* samurai, Uruk-hai */
	    (len >= 3 && !strcmp(spot-2, " ya")) ||
	    (len >= 4 &&
	     (!strcmp(spot-3, "fish") || !strcmp(spot-3, "tuna") ||
	      !strcmp(spot-3, "deer") || !strcmp(spot-3, "yaki"))) ||
	    (len >= 5 && (!strcmp(spot-4, "sheep") ||
			!strcmp(spot-4, "ninja") ||
			!strcmp(spot-4, "ronin") ||
			!strcmp(spot-4, "shito") ||
			!strcmp(spot-7, "shuriken") ||
			!strcmp(spot-4, "tengu") ||
			!strcmp(spot-4, "manes"))) ||
	    (len >= 6 && !strcmp(spot-5, "ki-rin")) ||
	    (len >= 6 && !strcmp(spot-5, "Nazgul")) ||
	    (len >= 7 && !strcmp(spot-6, "gunyoki")))
		goto bottom;

	/* man/men ("Wiped out all cavemen.") */
	if (len >= 3 && !strcmp(spot-2, "man") &&
			(len<6 || strcmp(spot-5, "shaman")) &&
			(len<5 || strcmp(spot-4, "human"))) {
		*(spot-1) = 'e';
		goto bottom;
	}

	/* tooth/teeth */
	if (len >= 5 && !strcmp(spot-4, "tooth")) {
		strcpy(spot-3, "eeth");
		goto bottom;
	}

	/* knife/knives, etc... */
	if (!strcmp(spot-1, "fe")) {
		strcpy(spot-1, "ves");
		goto bottom;
	} else if (*spot == 'f') {
		if (strchr("lr", *(spot-1)) || strchr(vowels, *(spot-1))) {
			strcpy(spot, "ves");
			goto bottom;
		} else if (len >= 5 && !strncmp(spot-4, "staf", 4)) {
			strcpy(spot-1, "ves");
			goto bottom;
		}
	}

	/* foot/feet (body part) */
	if (len >= 4 && !strcmp(spot-3, "foot")) {
		strcpy(spot-2, "eet");
		goto bottom;
	}

	/* ium/ia (mycelia, baluchitheria) */
	if (len >= 3 && !strcmp(spot-2, "ium")) {
		*(spot--) = (char)0;
		*spot = 'a';
		goto bottom;
	}

	/* algae, larvae, hyphae (another fungus part) */
	if ((len >= 4 && !strcmp(spot-3, "alga")) ||
	    (len >= 5 &&
	     (!strcmp(spot-4, "hypha") || !strcmp(spot-4, "larva")))) {
		strcpy(spot, "ae");
		goto bottom;
	}

	/* fungus/fungi, homunculus/homunculi, but buses, lotuses, wumpuses */
	if (len > 3 && !strcmp(spot-1, "us") &&
	    (len < 5 || (strcmp(spot-4, "lotus") &&
			 (len < 6 || strcmp(spot-5, "wumpus"))))) {
		*(spot--) = (char)0;
		*spot = 'i';
		goto bottom;
	}

	/* vortex/vortices */
	if (len >= 6 && !strcmp(spot-3, "rtex")) {
		strcpy(spot-1, "ices");
		goto bottom;
	}

	/* djinni/djinn (note: also efreeti/efreet) */
	if (len >= 6 && !strcmp(spot-5, "djinni")) {
		*spot = (char)0;
		goto bottom;
	}

	/* mumak/mumakil */
	if (len >= 5 && !strcmp(spot-4, "mumak")) {
		strcpy(spot+1, "il");
		goto bottom;
	}

	/* sis/ses (nemesis) */
	if (len >= 3 && !strcmp(spot-2, "sis")) {
		*(spot-1) = 'e';
		goto bottom;
	}

	/* erinys/erinyes */
	if (len >= 6 && !strcmp(spot-5, "erinys")) {
		strcpy(spot, "es");
		goto bottom;
	}

	/* mouse/mice,louse/lice (not a monster, but possible in food names) */
	if (len >= 5 && !strcmp(spot-3, "ouse") && strchr("MmLl", *(spot-4))) {
		strcpy(spot-3, "ice");
		goto bottom;
	}

	/* matzoh/matzot, possible food name */
	if (len >= 6 && (!strcmp(spot-5, "matzoh")
					|| !strcmp(spot-5, "matzah"))) {
		strcpy(spot-1, "ot");
		goto bottom;
	}
	if (len >= 5 && (!strcmp(spot-4, "matzo")
					|| !strcmp(spot-5, "matza"))) {
		strcpy(spot, "ot");
		goto bottom;
	}

	/* child/children (for wise guys who give their food funny names) */
	if (len >= 5 && !strcmp(spot-4, "child")) {
		strcpy(spot, "dren");
		goto bottom;
	}

	/* note: -eau/-eaux (gateau, bordeau...) */
	/* note: ox/oxen, VAX/VAXen, goose/geese */

	/* Ends in z, x, s, ch, sh; add an "es" */
	if (strchr("zxs", *spot)
			|| (len >= 2 && *spot=='h' && strchr("cs", *(spot-1)))
	/* Kludge to get "tomatoes" and "potatoes" right */
			|| (len >= 4 && !strcmp(spot-2, "ato"))) {
		strcpy(spot+1, "es");
		goto bottom;
	}

	/* Ends in y preceded by consonant (note: also "qu") change to "ies" */
	if (*spot == 'y' &&
	    (!strchr(vowels, *(spot-1)))) {
		strcpy(spot, "ies");
		goto bottom;
	}

	/* Default: append an 's' */
	strcpy(spot+1, "s");

bottom:	if (excess) strcpy(eos(str), excess);
	return str;
}